

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.h
# Opt level: O3

Vector * __thiscall
KDIS::UTILS::Matrix<float,_(unsigned_char)'\x03',_(unsigned_char)'\x03'>::operator*
          (Vector *__return_storage_ptr__,
          Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *this,Vector *Value)

{
  float fVar1;
  float fVar2;
  KFLOAT32 *pKVar3;
  KUINT16 i;
  long lVar4;
  KUINT16 j;
  long lVar5;
  
  DATA_TYPE::Vector::Vector(__return_storage_ptr__);
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      fVar1 = (*(float (*) [3])*(float (*) [3])this)[lVar5];
      pKVar3 = DATA_TYPE::Vector::operator[](Value,(KUINT16)lVar5);
      fVar2 = (float)*pKVar3;
      pKVar3 = DATA_TYPE::Vector::operator[](__return_storage_ptr__,(KUINT16)lVar4);
      *pKVar3 = (KFLOAT32)(fVar1 * fVar2 + (float)*pKVar3);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = lVar4 + 1;
    this = (Matrix<float,_(unsigned_char)__x03_,_(unsigned_char)__x03_> *)((long)this + 0xc);
  } while (lVar4 != 3);
  return __return_storage_ptr__;
}

Assistant:

KDIS::DATA_TYPE::Vector operator * ( const KDIS::DATA_TYPE::Vector& Value )
    {
        KDIS::DATA_TYPE::Vector res;
        for( KUINT16 i = 0; i < rows; ++i )
        {
            for( KUINT16 j = 0; j < cols; ++j )
            {
                res[i] += Data[i][j] * Value[j];
            }
        }

        return res;
    }